

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_linux_endian.c
# Opt level: O1

void test_convert_be64toh(void)

{
  uint64_t check;
  uint64_t check_pattern;
  uint64_t local_18 [2];
  
  local_18[1] = 0x123456789abcdef0;
  local_18[0] = cio_be64toh(0xf0debc9a78563412);
  UnityAssertEqualMemory
            (local_18 + 1,local_18,8,1,"64 bit endian conversion incorrect!",99,UNITY_ARRAY_TO_ARRAY
            );
  return;
}

Assistant:

static void test_convert_be64toh(void)
{
	uint8_t pattern_array[] = {0x12, 0x34, 0x56, 0x78, 0x9a, 0xbc, 0xde, 0xf0};
	uint64_t pattern;
	memcpy(&pattern, pattern_array, sizeof(pattern));
	uint64_t check_pattern = 0x123456789abcdef0;
	uint64_t check = cio_be64toh(pattern);

	TEST_ASSERT_EQUAL_MEMORY_MESSAGE(&check_pattern, &check, sizeof(check), "64 bit endian conversion incorrect!");
}